

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O1

void __thiscall QFileDevicePrivate::QFileDevicePrivate(QFileDevicePrivate *this)

{
  QIODevicePrivate::QIODevicePrivate(&this->super_QIODevicePrivate,0x60a00);
  (this->super_QIODevicePrivate)._vptr_QIODevicePrivate =
       (_func_int **)&PTR__QFileDevicePrivate_0018a398;
  (this->fileEngine)._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = (QAbstractFileEngine *)0x0;
  this->cachedSize = 0;
  *(undefined8 *)((long)&this->cachedSize + 1) = 0;
  *(undefined8 *)
   ((long)&(this->handleFlags).super_QFlagsStorageHelper<QFileDevice::FileHandleFlag,_4>.
           super_QFlagsStorage<QFileDevice::FileHandleFlag>.i + 1) = 0;
  (this->super_QIODevicePrivate).writeBufferChunkSize = 0x4000;
  return;
}

Assistant:

QFileDevicePrivate::QFileDevicePrivate()
    : cachedSize(0),
      error(QFile::NoError), lastWasWrite(false)
{
    writeBufferChunkSize = QFILE_WRITEBUFFER_SIZE;
}